

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O0

bool __thiscall
Lib::DHMap<Indexing::IndexType,_Indexing::IndexManager::Entry,_Lib::DefaultHash,_Lib::DefaultHash2>
::set(DHMap<Indexing::IndexType,_Indexing::IndexManager::Entry,_Lib::DefaultHash,_Lib::DefaultHash2>
      *this,IndexType key,Entry val)

{
  Entry *pEVar1;
  undefined4 in_ECX;
  Index *in_RDX;
  IndexType in_ESI;
  uint *in_RDI;
  bool bVar2;
  bool exists;
  Entry *e;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 in_stack_ffffffffffffffd7;
  undefined4 in_stack_fffffffffffffffc;
  
  ensureExpanded((DHMap<Indexing::IndexType,_Indexing::IndexManager::Entry,_Lib::DefaultHash,_Lib::DefaultHash2>
                  *)CONCAT17(in_stack_ffffffffffffffd7,
                             CONCAT16(in_stack_ffffffffffffffd6,in_stack_ffffffffffffffd0)));
  pEVar1 = findEntryToInsert((DHMap<Indexing::IndexType,_Indexing::IndexManager::Entry,_Lib::DefaultHash,_Lib::DefaultHash2>
                              *)CONCAT44(in_stack_fffffffffffffffc,in_ECX),(IndexType *)in_RDX);
  bVar2 = false;
  if ((uint)(pEVar1->field_0)._infoData >> 2 == *in_RDI) {
    bVar2 = ((pEVar1->field_0)._infoData & 1U) == 0;
  }
  if (!bVar2) {
    if ((uint)(pEVar1->field_0)._infoData >> 2 == *in_RDI) {
      in_RDI[2] = in_RDI[2] - 1;
    }
    else {
      (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 3U | *in_RDI << 2;
      (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 0xfffffffd;
    }
    (pEVar1->field_0)._infoData = (pEVar1->field_0)._infoData & 0xfffffffe;
    pEVar1->_key = in_ESI;
    in_RDI[1] = in_RDI[1] + 1;
  }
  (pEVar1->_val).index = in_RDX;
  *(ulong *)&(pEVar1->_val).refCnt = CONCAT44(in_stack_fffffffffffffffc,in_ECX);
  return (bool)(bVar2 ^ 1);
}

Assistant:

bool set(Key key, Val val)
  {
    ensureExpanded();
    Entry* e = findEntryToInsert(std::move(key));
    bool exists = e->_info.timestamp==_timestamp && !e->_info.deleted;
    if(!exists) {
      if(e->_info.timestamp!=_timestamp) {
	e->_info.timestamp=_timestamp;
	//no collision has occured on this entry while this _timestamp is set
	e->_info.collision=0;
      } else {
	ASS(e->_info.deleted);
	_deleted--;
      }
      e->_info.deleted=0;
      e->_key=key;
      _size++;
    }
    e->_val = std::move(val);
    return !exists;
  }